

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O2

char * cmsys::regbranch(int *flagp)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  size_t sVar5;
  char *opnd;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  byte *pbVar9;
  uint uVar10;
  uint local_44;
  char *local_40;
  char *local_38;
  
  *flagp = 0;
  local_40 = regnode('\x06');
  pbVar9 = regparse;
  pcVar6 = (char *)0x0;
  do {
    bVar3 = *pbVar9;
    if (((bVar3 == 0) || (bVar3 == 0x29)) || (bVar3 == 0x7c)) {
      if (pcVar6 == (char *)0x0) {
        regnode('\t');
      }
      return local_40;
    }
    regparse = pbVar9 + 1;
    switch(bVar3) {
    case 0x24:
      cVar2 = '\x02';
LAB_00143b42:
      opnd = regnode(cVar2);
      uVar10 = 0;
      break;
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x29:
    case 0x2c:
    case 0x2d:
switchD_00143a44_caseD_25:
      regparse = pbVar9;
      sVar5 = strcspn((char *)pbVar9,"^$.[()|?+*\\");
      uVar4 = (uint)sVar5;
      if ((int)uVar4 < 1) {
        pcVar6 = "RegularExpression::compile(): Internal error.";
        goto LAB_00143ec3;
      }
      uVar8 = 1;
      uVar10 = 3;
      if (uVar4 != 1) {
        if (((ulong)pbVar9[uVar4 & 0x7fffffff] < 0x40) &&
           ((0x80000c0000000000U >> ((ulong)pbVar9[uVar4 & 0x7fffffff] & 0x3f) & 1) != 0)) {
          uVar8 = (ulong)(uVar4 - 1);
          uVar10 = (uint)(uVar4 - 1 == 1) * 2 + 1;
        }
        else {
          uVar8 = sVar5 & 0xffffffff;
          uVar10 = 1;
        }
      }
      opnd = regnode('\b');
      pbVar9 = regparse;
      while( true ) {
        if ((int)uVar8 < 1) break;
        regparse = pbVar9 + 1;
        regc(*pbVar9);
        uVar8 = (ulong)((int)uVar8 - 1);
        pbVar9 = pbVar9 + 1;
      }
      regc('\0');
      break;
    case 0x28:
      opnd = reg(1,(int *)&local_44);
      if (opnd == (char *)0x0) {
        return (char *)0x0;
      }
      uVar10 = local_44 & 5;
      goto LAB_00143ca6;
    case 0x2a:
    case 0x2b:
switchD_00143a44_caseD_2a:
      pcVar6 = "RegularExpression::compile(): ?+* follows nothing.";
      goto LAB_00143ec3;
    case 0x2e:
      uVar10 = 3;
      opnd = regnode('\x03');
      break;
    default:
      if (bVar3 == 0x5b) {
        if (*regparse == 0x5e) {
          opnd = regnode('\x05');
          regparse = regparse + 1;
        }
        else {
          opnd = regnode('\x04');
        }
        bVar3 = *regparse;
        pbVar9 = regparse;
        if (bVar3 == 0x5d) goto LAB_00143bfd;
        if (bVar3 == 0x2d) goto LAB_00143bfd;
        while( true ) {
          while (bVar3 = *pbVar9, bVar3 == 0x2d) {
            regparse = pbVar9 + 1;
            bVar3 = pbVar9[1];
            if ((bVar3 == 0x5d) || (bVar3 == 0)) {
              regc('-');
              pbVar9 = regparse;
            }
            else {
              uVar10 = (uint)pbVar9[-1];
              if (bVar3 < pbVar9[-1]) {
                pcVar6 = "RegularExpression::compile(): Invalid range in [].";
                goto LAB_00143ec3;
              }
              while (bVar3 != uVar10) {
                uVar10 = uVar10 + 1;
                regc((char)uVar10);
              }
              regparse = regparse + 1;
              pbVar9 = regparse;
            }
          }
          if ((bVar3 == 0) || (bVar3 == 0x5d)) break;
LAB_00143bfd:
          regparse = pbVar9 + 1;
          regc(bVar3);
          pbVar9 = pbVar9 + 1;
        }
        regc('\0');
        if (*regparse != 0x5d) {
          pcVar6 = "RegularExpression::compile(): Unmatched [].";
          goto LAB_00143ec3;
        }
        regparse = regparse + 1;
      }
      else {
        if (bVar3 != 0x5c) {
          if (bVar3 != 0x5e) {
            if (bVar3 == 0x3f) goto switchD_00143a44_caseD_2a;
            goto switchD_00143a44_caseD_25;
          }
          cVar2 = '\x01';
          goto LAB_00143b42;
        }
        if (*regparse == 0) {
          pcVar6 = "RegularExpression::compile(): Trailing backslash.";
          goto LAB_00143ec3;
        }
        opnd = regnode('\b');
        bVar3 = *regparse;
        regparse = regparse + 1;
        regc(bVar3);
        regc('\0');
      }
      uVar10 = 3;
    }
    if (opnd == (char *)0x0) {
      return (char *)0x0;
    }
LAB_00143ca6:
    bVar3 = *regparse;
    if (((ulong)bVar3 < 0x40) && ((0x80000c0000000000U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) {
      if (bVar3 != 0x3f && (uVar10 & 1) == 0) {
        pcVar6 = "RegularExpression::compile() : *+ operand could be empty.";
        goto LAB_00143ec3;
      }
      local_38 = pcVar6;
      if (bVar3 == 0x2a) {
        if ((uVar10 & 2) == 0) {
          reginsert('\x06',opnd);
          pcVar6 = regnode('\a');
          regoptail(opnd,pcVar6);
          regoptail(opnd,opnd);
          pcVar7 = regnode('\x06');
          pcVar6 = opnd;
LAB_00143d7b:
          regtail(pcVar6,pcVar7);
          pcVar6 = regnode('\t');
          regtail(opnd,pcVar6);
        }
        else {
          cVar2 = '\n';
LAB_00143de4:
          reginsert(cVar2,opnd);
        }
      }
      else {
        if (bVar3 == 0x2b) {
          if ((uVar10 & 2) != 0) {
            cVar2 = '\v';
            goto LAB_00143de4;
          }
          pcVar6 = regnode('\x06');
          regtail(opnd,pcVar6);
          pcVar7 = regnode('\a');
          regtail(pcVar7,opnd);
          pcVar7 = regnode('\x06');
          goto LAB_00143d7b;
        }
        if (bVar3 == 0x3f) {
          reginsert('\x06',opnd);
          pcVar6 = regnode('\x06');
          regtail(opnd,pcVar6);
          pcVar6 = regnode('\t');
          regtail(opnd,pcVar6);
          regoptail(opnd,pcVar6);
        }
      }
      uVar10 = (uint)(bVar3 != 0x2b) * 3 + 1;
      pbVar9 = regparse + 1;
      pbVar1 = regparse + 1;
      pcVar6 = local_38;
      regparse = pbVar9;
      if (((ulong)*pbVar1 < 0x40) && ((0x80000c0000000000U >> ((ulong)*pbVar1 & 0x3f) & 1) != 0)) {
        pcVar6 = "RegularExpression::compile(): Nested *?+.";
LAB_00143ec3:
        puts(pcVar6);
        return (char *)0x0;
      }
    }
    pbVar9 = regparse;
    uVar4 = uVar10 & 1 | *flagp;
    *flagp = uVar4;
    if (pcVar6 == (char *)0x0) {
      *flagp = uVar4 | uVar10 & 0xfffffffc;
      pcVar6 = opnd;
    }
    else {
      regtail(pcVar6,opnd);
      pbVar9 = regparse;
      pcVar6 = opnd;
    }
  } while( true );
}

Assistant:

static char* regbranch (int *flagp) {
    char* ret;
    char* chain;
    char* latest;
    int   flags;

    *flagp = WORST;             // Tentatively.

    ret = regnode(BRANCH);
    chain = 0;
    while (*regparse != '\0' && *regparse != '|' && *regparse != ')') {
        latest = regpiece(&flags);
        if (latest == 0)
            return (0);
        *flagp |= flags & HASWIDTH;
        if (chain == 0) // First piece.
            *flagp |= flags & SPSTART;
        else
            regtail(chain, latest);
        chain = latest;
    }
    if (chain == 0)             // Loop ran zero times.
        regnode(NOTHING);

    return (ret);
}